

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcSetGeometryInstancedScene(RTCGeometry hgeometry,RTCScene hscene)

{
  undefined8 *puVar1;
  allocator local_59;
  Ref<embree::Scene> scene;
  DeviceEnterLeave enterleave;
  
  scene.ptr = (Scene *)hscene;
  if (hscene == (RTCScene)0x0) {
    if (hgeometry != (RTCGeometry)0x0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_59);
      *puVar1 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar1 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&enterleave);
      __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
    }
  }
  else {
    (**(code **)(*(long *)hscene + 0x10))(hscene);
    if (hgeometry != (RTCGeometry)0x0) {
      embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hgeometry);
      (**(code **)(*(long *)hgeometry + 0x120))(hgeometry,&scene);
      embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
      if (scene.ptr != (Scene *)0x0) {
        (*((scene.ptr)->super_AccelN).super_Accel.super_AccelData.super_RefCount._vptr_RefCount[3])
                  ();
      }
      return;
    }
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_59);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&enterleave);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetGeometryInstancedScene(RTCGeometry hgeometry, RTCScene hscene)
  {
    Geometry* geometry = (Geometry*) hgeometry;
    Ref<Scene> scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetGeometryInstancedScene);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_VERIFY_HANDLE(hscene);
    RTC_ENTER_DEVICE(hgeometry);
    geometry->setInstancedScene(scene);
    RTC_CATCH_END2(geometry);
  }